

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psbt.cpp
# Opt level: O2

void __thiscall Psbt_SetOutputRecordTest_Test::TestBody(Psbt_SetOutputRecordTest_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  pointer puVar5;
  char *pcVar6;
  char *in_R9;
  ByteData output_bip32_key1;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_7;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  ByteData get_gval1;
  ByteData global_key1;
  ByteData get_gval2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_val_bytes;
  ByteData global_key2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_key_bytes;
  AssertionResult gtest_ar_10;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  ByteData global_value2;
  ByteData global_value1;
  Psbt psbt2;
  Psbt psbt;
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  HDWallet wallet2;
  HDWallet wallet1;
  KeyData get_val1;
  string path2;
  string path1;
  KeyData get_val2;
  Address addr1;
  KeyData key1;
  KeyData key2;
  Address addr2;
  
  std::__cxx11::string::string
            ((string *)&addr1,
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,(allocator *)&addr2);
  cfd::core::Psbt::Psbt(&psbt,(string *)&addr1);
  std::__cxx11::string::~string((string *)&addr1);
  cfd::core::ByteData::ByteData((ByteData *)&addr1,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&wallet1,(ByteData *)&addr1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr1);
  cfd::core::ByteData::ByteData((ByteData *)&addr1,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&wallet2,(ByteData *)&addr1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr1);
  std::__cxx11::string::string((string *)&path1,"44h/0h/0h/0/2",(allocator *)&addr1);
  std::__cxx11::string::string((string *)&path2,"44h/0h/0h/0/2",(allocator *)&addr1);
  cfd::core::HDWallet::GeneratePubkeyData(&key1,&wallet1,kTestnet,&path1);
  cfd::core::HDWallet::GeneratePubkeyData(&key2,&wallet2,kTestnet,&path2);
  cfd::core::KeyData::GetPubkey((Pubkey *)&addr2,&key1);
  cfd::core::Address::Address(&addr1,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::KeyData::GetPubkey(&get_val1.pubkey_,&key2);
  cfd::core::Address::Address(&addr2,kCfdIllegalArgumentError,kVersion0,&get_val1.pubkey_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&txout_key_bytes,0x22,(allocator_type *)&get_val1);
  txout_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  txout_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  txout_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = '\x02';
  cfd::core::KeyData::GetPubkey(&get_val2.pubkey_,&key1);
  cfd::core::Pubkey::GetData((ByteData *)&get_val1,&get_val2.pubkey_);
  cfd::core::ByteData::GetBytes(&pk_bytes1,(ByteData *)&get_val1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val2);
  cfd::core::KeyData::GetPubkey(&get_val2.pubkey_,&key2);
  cfd::core::Pubkey::GetData((ByteData *)&get_val1,&get_val2.pubkey_);
  cfd::core::ByteData::GetBytes(&pk_bytes2,(ByteData *)&get_val1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val2);
  cfd::core::KeyData::GetFingerprint((ByteData *)&get_val1,&key1);
  cfd::core::ByteData::GetBytes(&fp1,(ByteData *)&get_val1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val1);
  cfd::core::KeyData::GetFingerprint((ByteData *)&get_val1,&key2);
  cfd::core::ByteData::GetBytes(&fp2,(ByteData *)&get_val1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val1);
  cfd::core::KeyData::GetChildNumArray(&plist1,&key1);
  cfd::core::KeyData::GetChildNumArray(&plist2,&key2);
  txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] =
       pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[0x20];
  uVar1 = *(undefined8 *)
           pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = *(undefined8 *)
           (pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 8);
  uVar3 = *(undefined8 *)
           (pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x18);
  *(undefined8 *)
   (txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x11) =
       *(undefined8 *)
        (pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  *(undefined8 *)
   (txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x19) = uVar3;
  *(undefined8 *)
   (txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 1) = uVar1;
  *(undefined8 *)
   (txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 9) = uVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&txout_val_bytes,
             (long)plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish +
             (4 - (long)plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start));
  *(undefined4 *)
   txout_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start =
       *(undefined4 *)
        fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  memcpy(txout_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 4,
         plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
  cfd::core::ByteData::ByteData(&txout_key1,&txout_key_bytes);
  cfd::core::ByteData::ByteData(&txout_value1,&txout_val_bytes);
  txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] =
       pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start[0x20];
  uVar1 = *(undefined8 *)
           pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = *(undefined8 *)
           (pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 8);
  uVar3 = *(undefined8 *)
           (pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x18);
  *(undefined8 *)
   (txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x11) =
       *(undefined8 *)
        (pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 0x10);
  *(undefined8 *)
   (txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 0x19) = uVar3;
  *(undefined8 *)
   (txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 1) = uVar1;
  *(undefined8 *)
   (txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start + 9) = uVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&txout_val_bytes,
             (long)plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish +
             (4 - (long)plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start));
  *(undefined4 *)
   txout_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start =
       *(undefined4 *)
        fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  memcpy(txout_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start + 4,
         plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,
         (long)plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
  cfd::core::ByteData::ByteData(&txout_key2,&txout_key_bytes);
  cfd::core::ByteData::ByteData(&txout_value2,&txout_val_bytes);
  cfd::core::Psbt::SetTxOutRecord(&psbt,0,&txout_key1,&txout_value1);
  cfd::core::Psbt::SetTxOutRecord(&psbt,1,&txout_key2,&txout_value2);
  cfd::core::Psbt::GetData((ByteData *)&get_val2,&psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&get_val1,(ByteData *)&get_val2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&psbt2,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
             ,(char *)get_val1.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&get_val1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val2);
  if ((char)psbt2._vptr_Psbt == '\0') {
    testing::Message::Message((Message *)&get_val1);
    if (psbt2.wally_psbt_pointer_ == (void *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *psbt2.wally_psbt_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&get_val2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3df,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&get_val2,(Message *)&get_val1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&get_val2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&get_val1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&psbt2.wally_psbt_pointer_);
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&get_val1,&psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&get_val2,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
             ,(char *)get_val1.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&get_val1);
  if ((char)get_val2.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&get_val1);
    if (get_val2.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)get_val2.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&psbt2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3e0,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&psbt2,(Message *)&get_val1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&psbt2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&get_val1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)((long)&get_val2.pubkey_.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data + 8));
  cfd::core::Psbt::GetData((ByteData *)&get_val1,&psbt);
  cfd::core::Psbt::Psbt(&psbt2,(ByteData *)&get_val1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_val1);
  cfd::core::Psbt::GetTxOutKeyData(&get_val1,&psbt2,0,false);
  cfd::core::Psbt::GetTxOutKeyData(&get_val2,&psbt2,1,false);
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&gtest_ar_6,&get_val1,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&output_bip32_key1,&key1,true,kApostrophe,false)
  ;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&global_key1,"get_val1.ToString()","key1.ToString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_bip32_key1
            );
  std::__cxx11::string::~string((string *)&output_bip32_key1);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  if ((char)global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)global_key1.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_bip32_key1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3e5,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_bip32_key1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_bip32_key1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&global_key1.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&gtest_ar_6,&get_val2,true,kApostrophe,false);
  cfd::core::KeyData::ToString_abi_cxx11_((string *)&output_bip32_key1,&key2,true,kApostrophe,false)
  ;
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&global_key1,"get_val2.ToString()","key2.ToString()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_bip32_key1
            );
  std::__cxx11::string::~string((string *)&output_bip32_key1);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  if ((char)global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (global_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)global_key1.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_bip32_key1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3e6,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_bip32_key1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_bip32_key1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&global_key1.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  std::__cxx11::string::string((string *)&gtest_ar_6,"cfd",(allocator *)&global_value1);
  std::__cxx11::string::string((string *)&output_bip32_key1,"dummy1",(allocator *)&global_key2);
  cfd::core::Psbt::CreateRecordKey
            (&global_key1,0xfc,(string *)&gtest_ar_6,'\0',(string *)&output_bip32_key1);
  std::__cxx11::string::~string((string *)&output_bip32_key1);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  std::__cxx11::string::string((string *)&gtest_ar_6,"01020304",(allocator *)&output_bip32_key1);
  cfd::core::ByteData::ByteData(&global_value1,(string *)&gtest_ar_6);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  std::__cxx11::string::string((string *)&gtest_ar_6,"cfd",(allocator *)&global_value2);
  std::__cxx11::string::string((string *)&output_bip32_key1,"dummy2",(allocator *)&get_gval1);
  cfd::core::Psbt::CreateRecordKey
            (&global_key2,0xfc,(string *)&gtest_ar_6,'\0',(string *)&output_bip32_key1);
  std::__cxx11::string::~string((string *)&output_bip32_key1);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  std::__cxx11::string::string((string *)&gtest_ar_6,"00",(allocator *)&output_bip32_key1);
  cfd::core::ByteData::ByteData(&global_value2,(string *)&gtest_ar_6);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  cfd::core::Psbt::SetTxOutRecord(&psbt,0,&global_key1,&global_value1);
  bVar4 = cfd::core::Psbt::IsFindTxOutRecord(&psbt,0,&global_key1);
  output_bip32_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(output_bip32_key1.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar4);
  output_bip32_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&get_gval1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6,(internal *)&output_bip32_key1,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key1)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&get_gval2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3ed,(char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&get_gval2,(Message *)&get_gval1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&get_gval2);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&get_gval1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&output_bip32_key1.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  bVar4 = cfd::core::Psbt::IsFindTxOutRecord(&psbt,0,&global_key2);
  output_bip32_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(output_bip32_key1.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,!bVar4);
  output_bip32_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar4) {
    testing::Message::Message((Message *)&get_gval1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6,(internal *)&output_bip32_key1,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&get_gval2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3ee,(char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&get_gval2,(Message *)&get_gval1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&get_gval2);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&get_gval1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&output_bip32_key1.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::Psbt::SetTxOutRecord(&psbt,0,&global_key2,&global_value2);
  bVar4 = cfd::core::Psbt::IsFindTxOutRecord(&psbt,0,&global_key2);
  output_bip32_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT71(output_bip32_key1.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,bVar4);
  output_bip32_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&get_gval1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_6,(internal *)&output_bip32_key1,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&get_gval2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3f0,(char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&get_gval2,(Message *)&get_gval1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&get_gval2);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&get_gval1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&output_bip32_key1.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::Psbt::GetData(&output_bip32_key1,&psbt);
  cfd::core::Psbt::Psbt((Psbt *)&gtest_ar_6,&output_bip32_key1);
  cfd::core::Psbt::operator=(&psbt2,(Psbt *)&gtest_ar_6);
  cfd::core::Psbt::~Psbt((Psbt *)&gtest_ar_6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&output_bip32_key1);
  cfd::core::Psbt::GetTxOutRecord(&get_gval1,&psbt2,0,&global_key1);
  cfd::core::Psbt::GetTxOutRecord(&get_gval2,&psbt2,0,&global_key2);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_6,&get_gval1);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&output_bip32_key1,&global_value1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&key_list,"get_gval1.GetHex()","global_value1.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_bip32_key1
            );
  std::__cxx11::string::~string((string *)&output_bip32_key1);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  if ((char)key_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (key_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      puVar5 = "";
    }
    else {
      puVar5 = ((key_list.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_bip32_key1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3f5,(char *)puVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_bip32_key1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_bip32_key1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&key_list.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_6,&get_gval2);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&output_bip32_key1,&global_value2);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&key_list,"get_gval2.GetHex()","global_value2.GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output_bip32_key1
            );
  std::__cxx11::string::~string((string *)&output_bip32_key1);
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  if ((char)key_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (key_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      puVar5 = "";
    }
    else {
      puVar5 = ((key_list.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_finish)->data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output_bip32_key1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3f6,(char *)puVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&output_bip32_key1,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_bip32_key1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&key_list.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
  cfd::core::Psbt::GetTxOutRecordKeyList(&key_list,&psbt2,0);
  gtest_ar_7.success_ = true;
  gtest_ar_7._1_3_ = 0;
  output_bip32_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(((long)key_list.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 CONCAT71(key_list.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_start._1_7_,
                          (char)key_list.
                                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                ._M_impl.super__Vector_impl_data._M_start)) / 0x18);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar_6,"2","key_list.size()",(int *)&gtest_ar_7,
             (unsigned_long *)&output_bip32_key1);
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&output_bip32_key1);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3f9,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_7,(Message *)&output_bip32_key1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&output_bip32_key1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_6.message_);
  if ((long)key_list.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      CONCAT71(key_list.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start._1_7_,
               (char)key_list.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_start) == 0x30) {
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_6,&global_key1);
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&output_bip32_key1,
               (ByteData *)
               CONCAT71(key_list.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        (char)key_list.
                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                              ._M_impl.super__Vector_impl_data._M_start));
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_7,"global_key1.GetHex()","key_list[0].GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &output_bip32_key1);
    std::__cxx11::string::~string((string *)&output_bip32_key1);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (gtest_ar_7.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_bip32_key1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x3fb,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_bip32_key1,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_bip32_key1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_6);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_7.message_);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_6,&global_key2);
    cfd::core::ByteData::GetHex_abi_cxx11_
              ((string *)&output_bip32_key1,
               (ByteData *)
               (CONCAT71(key_list.
                         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)key_list.
                               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                               ._M_impl.super__Vector_impl_data._M_start) + 0x18));
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&gtest_ar_7,"global_key2.GetHex()","key_list[1].GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_6,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &output_bip32_key1);
    std::__cxx11::string::~string((string *)&output_bip32_key1);
    std::__cxx11::string::~string((string *)&gtest_ar_6);
    if (gtest_ar_7.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_6);
      if (gtest_ar_7.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&output_bip32_key1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
                 ,0x3fc,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&output_bip32_key1,(Message *)&gtest_ar_6);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output_bip32_key1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&gtest_ar_6);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_7.message_);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_((string *)&gtest_ar_6,&psbt2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&output_bip32_key1,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
             ,(char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  if ((char)output_bip32_key1.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (output_bip32_key1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)output_bip32_key1.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x3fe,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&output_bip32_key1.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::KeyData::GetPubkey((Pubkey *)&gtest_ar_6,&key1);
  cfd::core::Psbt::CreatePubkeyRecordKey(&output_bip32_key1,'\x02',(Pubkey *)&gtest_ar_6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_6);
  cfd::core::Psbt::GetTxOutRecord((ByteData *)&gtest_ar_7,&psbt2,0,&output_bip32_key1);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&gtest_ar_6,(ByteData *)&gtest_ar_7);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_10,"\"2a7047602c00008000000080000000800000000002000000\"",
             "psbt2.GetTxOutRecord(0, output_bip32_key1).GetHex().c_str()",
             "2a7047602c00008000000080000000800000000002000000",
             (char *)CONCAT71(gtest_ar_6._1_7_,gtest_ar_6.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_6);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_7);
  if (gtest_ar_10.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar_10.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((gtest_ar_10.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_psbt.cpp"
               ,0x404,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_6);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_10.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&output_bip32_key1);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&key_list);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_gval2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&get_gval1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&global_value2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&global_key2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&global_value1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&global_key1);
  cfd::core::KeyData::~KeyData(&get_val2);
  cfd::core::KeyData::~KeyData(&get_val1);
  cfd::core::Psbt::~Psbt(&psbt2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout_value2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout_key2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout_value1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txout_key1);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&plist2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&plist1.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&fp2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&fp1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pk_bytes2.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pk_bytes1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&txout_val_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&txout_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  cfd::core::Address::~Address(&addr2);
  cfd::core::Address::~Address(&addr1);
  cfd::core::KeyData::~KeyData(&key2);
  cfd::core::KeyData::~KeyData(&key1);
  std::__cxx11::string::~string((string *)&path2);
  std::__cxx11::string::~string((string *)&path1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wallet2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wallet1);
  cfd::core::Psbt::~Psbt(&psbt);
  return;
}

Assistant:

TEST(Psbt, SetOutputRecordTest) {
  Psbt psbt("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  std::vector<uint8_t> txout_key_bytes(34);
  std::vector<uint8_t> txout_val_bytes;
  txout_key_bytes[0] = 2;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txout_key_bytes[1], pk_bytes1.data(), 33);
  txout_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txout_val_bytes.data(), fp1.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txout_key_bytes);
  ByteData txout_value1 = ByteData(txout_val_bytes);

  memcpy(&txout_key_bytes[1], pk_bytes2.data(), 33);
  txout_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txout_val_bytes.data(), fp2.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txout_key_bytes);
  ByteData txout_value2 = ByteData(txout_val_bytes);

  psbt.SetTxOutRecord(0, txout_key1, txout_value1);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(0, txout_key1));
  // EXPECT_FALSE(psbt.IsFindTxOutRecord(1, txout_key2));
  psbt.SetTxOutRecord(1, txout_key2, txout_value2);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(1, txout_key2));

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxOutKeyData(0);
  auto get_val2 = psbt2.GetTxOutKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxOutRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxOutRecord(0, global_key2));
  psbt.SetTxOutRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxOutRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxOutRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxOutRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", psbt2.GetBase64().c_str());

  ByteData output_bip32_key1 = Psbt::CreatePubkeyRecordKey(
      Psbt::kPsbtOutputBip32Derivation, key1.GetPubkey());
  EXPECT_STREQ(
      "2a7047602c00008000000080000000800000000002000000",
      psbt2.GetTxOutRecord(0, output_bip32_key1).GetHex().c_str());
}